

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateEqualsAndHashCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FieldDescriptor *pFVar5;
  FieldGeneratorInfo *pFVar6;
  ImmutableFieldGenerator *pIVar7;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *psVar8;
  MessageOptions *this_00;
  reference ppOVar9;
  OneofGeneratorInfo *pOVar10;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum local_180;
  string local_150;
  FieldDescriptor *local_130;
  FieldDescriptor *field_3;
  OneofDescriptor *pOStack_120;
  int j_1;
  OneofDescriptor *oneof_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *__range3_1;
  bool check_has_bits_1;
  FieldGeneratorInfo *info_1;
  FieldDescriptor *field_2;
  undefined1 local_e0 [4];
  int i_1;
  string local_b0;
  FieldDescriptor *local_90;
  FieldDescriptor *field_1;
  OneofDescriptor *pOStack_80;
  int j;
  OneofDescriptor *oneof;
  iterator __end3;
  iterator __begin3;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *__range3;
  bool check_has_bits;
  FieldGeneratorInfo *info;
  FieldDescriptor *field;
  int i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print<>(printer,"@java.lang.Override\npublic boolean equals(");
  io::Printer::Print<>(local_18,"final java.lang.Object obj) {\n");
  io::Printer::Indent(local_18);
  pPVar1 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_38,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar1,
             "if (obj == this) {\n return true;\n}\nif (!(obj instanceof $classname$)) {\n  return super.equals(obj);\n}\n$classname$ other = ($classname$) obj;\n\n"
             ,(char (*) [10])0x77c586,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  for (field._0_4_ = 0; iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_),
      (int)field < iVar3; field._0_4_ = (int)field + 1) {
    pFVar5 = Descriptor::field((this->super_MessageGenerator).descriptor_,(int)field);
    bVar2 = IsRealOneof(pFVar5);
    if (!bVar2) {
      pFVar6 = Context::GetFieldGeneratorInfo(this->context_,pFVar5);
      bVar2 = anon_unknown_18::CheckHasBitsForEqualsAndHashCode(pFVar5);
      if (bVar2) {
        io::Printer::Print<char[5],std::__cxx11::string>
                  (local_18,
                   "if (has$name$() != other.has$name$()) return false;\nif (has$name$()) {\n",
                   (char (*) [5])0x77db8d,&pFVar6->capitalized_name);
        io::Printer::Indent(local_18);
      }
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,pFVar5);
      (*pIVar7->_vptr_ImmutableFieldGenerator[0x12])(pIVar7,local_18);
      if (bVar2) {
        io::Printer::Outdent(local_18);
        io::Printer::Print<>(local_18,"}\n");
      }
    }
  }
  psVar8 = &(this->super_MessageGenerator).oneofs_;
  __end3 = std::
           set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
           ::begin(psVar8);
  oneof = (OneofDescriptor *)
          std::
          set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
          ::end(psVar8);
  while (bVar2 = std::operator!=(&__end3,(_Self *)&oneof), bVar2) {
    ppOVar9 = std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator*
                        (&__end3);
    pPVar1 = local_18;
    pOStack_80 = *ppOVar9;
    pOVar10 = Context::GetOneofGeneratorInfo(this->context_,pOStack_80);
    io::Printer::Print<char[23],std::__cxx11::string>
              (pPVar1,
               "if (!get$oneof_capitalized_name$Case().equals(other.get$oneof_capitalized_name$Case())) return false;\n"
               ,(char (*) [23])"oneof_capitalized_name",&pOVar10->capitalized_name);
    pPVar1 = local_18;
    pOVar10 = Context::GetOneofGeneratorInfo(this->context_,pOStack_80);
    io::Printer::Print<char[11],std::__cxx11::string>
              (pPVar1,"switch ($oneof_name$Case_) {\n",(char (*) [11])0x784886,&pOVar10->name);
    io::Printer::Indent(local_18);
    for (field_1._4_4_ = 0; iVar3 = field_1._4_4_, iVar4 = OneofDescriptor::field_count(pOStack_80),
        iVar3 < iVar4; field_1._4_4_ = field_1._4_4_ + 1) {
      local_90 = OneofDescriptor::field(pOStack_80,field_1._4_4_);
      pPVar1 = local_18;
      iVar3 = FieldDescriptor::number(local_90);
      strings::AlphaNum::AlphaNum((AlphaNum *)local_e0,iVar3);
      StrCat_abi_cxx11_(&local_b0,(protobuf *)local_e0,a);
      io::Printer::Print<char[13],std::__cxx11::string>
                (pPVar1,"case $field_number$:\n",(char (*) [13])"field_number",&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      io::Printer::Indent(local_18);
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,local_90);
      (*pIVar7->_vptr_ImmutableFieldGenerator[0x12])(pIVar7,local_18);
      io::Printer::Print<>(local_18,"break;\n");
      io::Printer::Outdent(local_18);
    }
    io::Printer::Print<>(local_18,"case 0:\ndefault:\n");
    io::Printer::Outdent(local_18);
    io::Printer::Print<>(local_18,"}\n");
    std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator++(&__end3);
  }
  io::Printer::Print<>(local_18,"if (!unknownFields.equals(other.unknownFields)) return false;\n");
  iVar3 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (0 < iVar3) {
    io::Printer::Print<>
              (local_18,
               "if (!getExtensionFields().equals(other.getExtensionFields()))\n  return false;\n");
  }
  io::Printer::Print<>(local_18,"return true;\n");
  io::Printer::Outdent(local_18);
  io::Printer::Print<>(local_18,"}\n\n");
  io::Printer::Print<>(local_18,"@java.lang.Override\npublic int hashCode() {\n");
  io::Printer::Indent(local_18);
  io::Printer::Print<>(local_18,"if (memoizedHashCode != 0) {\n");
  io::Printer::Indent(local_18);
  io::Printer::Print<>(local_18,"return memoizedHashCode;\n");
  io::Printer::Outdent(local_18);
  io::Printer::Print<>(local_18,"}\nint hash = 41;\n");
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar2 = MessageOptions::no_standard_descriptor_accessor(this_00);
  if (bVar2) {
    io::Printer::Print<>(local_18,"hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  }
  else {
    io::Printer::Print<>(local_18,"hash = (19 * hash) + getDescriptor().hashCode();\n");
  }
  for (field_2._4_4_ = 0;
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_),
      field_2._4_4_ < iVar3; field_2._4_4_ = field_2._4_4_ + 1) {
    pFVar5 = Descriptor::field((this->super_MessageGenerator).descriptor_,field_2._4_4_);
    bVar2 = IsRealOneof(pFVar5);
    if (!bVar2) {
      pFVar6 = Context::GetFieldGeneratorInfo(this->context_,pFVar5);
      bVar2 = anon_unknown_18::CheckHasBitsForEqualsAndHashCode(pFVar5);
      if (bVar2) {
        io::Printer::Print<char[5],std::__cxx11::string>
                  (local_18,"if (has$name$()) {\n",(char (*) [5])0x77db8d,&pFVar6->capitalized_name)
        ;
        io::Printer::Indent(local_18);
      }
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,pFVar5);
      (*pIVar7->_vptr_ImmutableFieldGenerator[0x13])(pIVar7,local_18);
      if (bVar2) {
        io::Printer::Outdent(local_18);
        io::Printer::Print<>(local_18,"}\n");
      }
    }
  }
  psVar8 = &(this->super_MessageGenerator).oneofs_;
  __end3_1 = std::
             set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
             ::begin(psVar8);
  oneof_1 = (OneofDescriptor *)
            std::
            set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
            ::end(psVar8);
  while (bVar2 = std::operator!=(&__end3_1,(_Self *)&oneof_1), bVar2) {
    ppOVar9 = std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator*
                        (&__end3_1);
    pPVar1 = local_18;
    pOStack_120 = *ppOVar9;
    pOVar10 = Context::GetOneofGeneratorInfo(this->context_,pOStack_120);
    io::Printer::Print<char[11],std::__cxx11::string>
              (pPVar1,"switch ($oneof_name$Case_) {\n",(char (*) [11])0x784886,&pOVar10->name);
    io::Printer::Indent(local_18);
    for (field_3._4_4_ = 0; iVar3 = field_3._4_4_, iVar4 = OneofDescriptor::field_count(pOStack_120)
        , iVar3 < iVar4; field_3._4_4_ = field_3._4_4_ + 1) {
      local_130 = OneofDescriptor::field(pOStack_120,field_3._4_4_);
      pPVar1 = local_18;
      iVar3 = FieldDescriptor::number(local_130);
      strings::AlphaNum::AlphaNum(&local_180,iVar3);
      StrCat_abi_cxx11_(&local_150,(protobuf *)&local_180,a_00);
      io::Printer::Print<char[13],std::__cxx11::string>
                (pPVar1,"case $field_number$:\n",(char (*) [13])"field_number",&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      io::Printer::Indent(local_18);
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,local_130);
      (*pIVar7->_vptr_ImmutableFieldGenerator[0x13])(pIVar7,local_18);
      io::Printer::Print<>(local_18,"break;\n");
      io::Printer::Outdent(local_18);
    }
    io::Printer::Print<>(local_18,"case 0:\ndefault:\n");
    io::Printer::Outdent(local_18);
    io::Printer::Print<>(local_18,"}\n");
    std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator++(&__end3_1);
  }
  iVar3 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (0 < iVar3) {
    io::Printer::Print<>(local_18,"hash = hashFields(hash, getExtensionFields());\n");
  }
  io::Printer::Print<>(local_18,"hash = (29 * hash) + unknownFields.hashCode();\n");
  io::Printer::Print<>(local_18,"memoizedHashCode = hash;\nreturn hash;\n");
  io::Printer::Outdent(local_18);
  io::Printer::Print<>(local_18,"}\n\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateEqualsAndHashCode(
    io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public boolean equals(");
  printer->Print("final java.lang.Object obj) {\n");
  printer->Indent();
  printer->Print(
      "if (obj == this) {\n"
      " return true;\n"
      "}\n"
      "if (!(obj instanceof $classname$)) {\n"
      "  return super.equals(obj);\n"
      "}\n"
      "$classname$ other = ($classname$) obj;\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print(
            "if (has$name$() != other.has$name$()) return false;\n"
            "if (has$name$()) {\n",
            "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateEqualsCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Compare oneofs.
  for (auto oneof : oneofs_) {
    printer->Print(
        "if (!get$oneof_capitalized_name$Case().equals("
        "other.get$oneof_capitalized_name$Case())) return false;\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateEqualsCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  // Always consider unknown fields for equality. This will sometimes return
  // false for non-canonical ordering when running in LITE_RUNTIME but it's
  // the best we can do.
  printer->Print(
      "if (!unknownFields.equals(other.unknownFields)) return false;\n");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!getExtensionFields().equals(other.getExtensionFields()))\n"
        "  return false;\n");
  }
  printer->Print("return true;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public int hashCode() {\n");
  printer->Indent();
  printer->Print("if (memoizedHashCode != 0) {\n");
  printer->Indent();
  printer->Print("return memoizedHashCode;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "int hash = 41;\n");

  // If we output a getDescriptor() method, use that as it is more efficient.
  if (descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print("hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  } else {
    printer->Print("hash = (19 * hash) + getDescriptor().hashCode();\n");
  }

  // hashCode non-oneofs.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print("if (has$name$()) {\n", "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateHashCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // hashCode oneofs.
  for (auto oneof : oneofs_) {
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateHashCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("hash = hashFields(hash, getExtensionFields());\n");
  }

  printer->Print("hash = (29 * hash) + unknownFields.hashCode();\n");
  printer->Print(
      "memoizedHashCode = hash;\n"
      "return hash;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");
}